

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void ucnv_setSubstChars_63(UConverter *converter,char *mySubChar,int8_t len,UErrorCode *err)

{
  UConverterStaticData *pUVar1;
  
  if (U_ZERO_ERROR < *err) {
    return;
  }
  pUVar1 = converter->sharedData->staticData;
  if ((pUVar1->maxBytesPerChar < len) || (len < pUVar1->minBytesPerChar)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    memcpy(converter->subChars,mySubChar,(long)len);
    converter->subCharLen = len;
    converter->subChar1 = '\0';
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }